

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void decode_opc_mxu(CPUMIPSState_conflict2 *env,DisasContext_conflict4 *ctx)

{
  TCGContext_conflict4 *s;
  TCGTemp *pTVar1;
  TCGLabel *l;
  uintptr_t o;
  TCGv_i32 pTVar2;
  uint uVar3;
  TCGOpcode TVar4;
  DisasContext_conflict4 *ctx_00;
  uint uVar5;
  uintptr_t o_2;
  TCGv_i32 ret;
  
  s = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
  uVar5 = (env->active_tc).gpr[10];
  uVar3 = uVar5 & 0x3f;
  if (uVar3 == 0x2f) {
    pTVar1 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)pTVar1 - (long)s);
    uVar5 = (env->active_tc).gpr[10];
    uVar3 = uVar5 >> 6 & 0x1f;
    uVar5 = uVar5 >> 0x10 & 0x1f;
    if (uVar5 == 0) {
      TVar4 = INDEX_op_movi_i32;
      pTVar2 = (TCGv_i32)0x0;
LAB_0083ac6d:
      tcg_gen_op2_mipsel(s,TVar4,(TCGArg)pTVar1,(TCGArg)pTVar2);
    }
    else if (s->cpu_gpr[uVar5] != ret) {
      pTVar2 = s->cpu_gpr[uVar5] + (long)s;
      TVar4 = INDEX_op_mov_i32;
      goto LAB_0083ac6d;
    }
    if (uVar3 < 0x10) {
      if (0xe < uVar3 - 1) goto LAB_0083accf;
      pTVar2 = s->mxu_gpr[uVar3 - 1];
    }
    else {
      if (uVar3 != 0x10) goto LAB_0083accf;
      pTVar2 = s->mxu_CR;
    }
  }
  else {
    if (uVar3 != 0x2e) {
      if (uVar3 == 2) {
        gen_arith((DisasContext_conflict4 *)env,uVar5 & 0xfc00003f,uVar5 >> 0xb & 0x1f,
                  uVar5 >> 0x15 & 0x1f,uVar5 >> 0x10 & 0x1f);
        return;
      }
      pTVar1 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
      ret = (TCGv_i32)((long)pTVar1 - (long)s);
      l = gen_new_label_mipsel(s);
      if (s->mxu_CR != ret) {
        tcg_gen_op2_mipsel(s,INDEX_op_mov_i32,(TCGArg)pTVar1,(TCGArg)(s->mxu_CR + (long)s));
      }
      tcg_gen_andi_i32_mipsel(s,ret,ret,0);
      ctx_00 = (DisasContext_conflict4 *)0x9;
      tcg_gen_brcondi_i32_mipsel(s,TCG_COND_NE,ret,0,l);
      switch(uVar3) {
      default:
        generate_exception_err((DisasContext_conflict4 *)env,0x14,0);
        break;
      case 3:
        decode_opc_mxu__pool00(env,ctx_00);
        break;
      case 8:
        gen_mxu_d16mul((DisasContext_conflict4 *)env);
        break;
      case 10:
        gen_mxu_d16mac((DisasContext_conflict4 *)env);
        break;
      case 0x10:
        decode_opc_mxu__pool04(env,ctx_00);
        break;
      case 0x15:
      case 0x16:
        __assert_fail("start >= 0 && length > 0 && length <= 32 - start",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                      ,0x11f,"uint32_t extract32(uint32_t, int, int)");
      case 0x22:
        gen_mxu_s8ldd((DisasContext_conflict4 *)env);
        break;
      case 0x27:
        decode_opc_mxu__pool16(env,ctx_00);
        break;
      case 0x38:
        decode_opc_mxu__pool19(env,ctx_00);
      }
      *(byte *)l = *(byte *)l | 1;
      tcg_gen_op1_mipsel(s,INDEX_op_set_label,(TCGArg)l);
      goto LAB_0083accf;
    }
    pTVar1 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)pTVar1 - (long)s);
    uVar5 = (env->active_tc).gpr[10];
    uVar3 = uVar5 >> 6 & 0x1f;
    uVar5 = uVar5 >> 0x10 & 0x1f;
    if (uVar3 < 0x10) {
      if (uVar3 == 0) {
        TVar4 = INDEX_op_movi_i32;
        pTVar2 = (TCGv_i32)0x0;
      }
      else {
        pTVar2 = s->mxu_gpr[uVar3 - 1];
LAB_0083ac4b:
        if (pTVar2 == ret) goto LAB_0083acaa;
        pTVar2 = pTVar2 + (long)s;
        TVar4 = INDEX_op_mov_i32;
      }
      tcg_gen_op2_mipsel(s,TVar4,(TCGArg)pTVar1,(TCGArg)pTVar2);
    }
    else if (uVar3 == 0x10) {
      pTVar2 = s->mxu_CR;
      goto LAB_0083ac4b;
    }
LAB_0083acaa:
    if (uVar5 == 0) goto LAB_0083accf;
    pTVar2 = s->cpu_gpr[uVar5];
  }
  if (pTVar2 != ret) {
    tcg_gen_op2_mipsel(s,INDEX_op_mov_i32,(TCGArg)(pTVar2 + (long)s),(TCGArg)pTVar1);
  }
LAB_0083accf:
  tcg_temp_free_internal_mipsel(s,(TCGTemp *)(ret + (long)s));
  return;
}

Assistant:

static void decode_opc_mxu(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    /*
     * TODO: Investigate necessity of including handling of
     * CLZ, CLO, SDBB in this function, as they belong to
     * SPECIAL2 opcode space for regular pre-R6 MIPS ISAs.
     */
    uint32_t opcode = extract32(ctx->opcode, 0, 6);

    if (opcode == OPC__MXU_MUL) {
        uint32_t  rs, rt, rd, op1;

        rs = extract32(ctx->opcode, 21, 5);
        rt = extract32(ctx->opcode, 16, 5);
        rd = extract32(ctx->opcode, 11, 5);
        op1 = MASK_SPECIAL2(ctx->opcode);

        gen_arith(ctx, op1, rd, rs, rt);

        return;
    }

    if (opcode == OPC_MXU_S32M2I) {
        gen_mxu_s32m2i(ctx);
        return;
    }

    if (opcode == OPC_MXU_S32I2M) {
        gen_mxu_s32i2m(ctx);
        return;
    }

    {
        TCGv t_mxu_cr = tcg_temp_new(tcg_ctx);
        TCGLabel *l_exit = gen_new_label(tcg_ctx);

        gen_load_mxu_cr(tcg_ctx, t_mxu_cr);
        tcg_gen_andi_tl(tcg_ctx, t_mxu_cr, t_mxu_cr, MXU_CR_MXU_EN);
        tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t_mxu_cr, MXU_CR_MXU_EN, l_exit);

        switch (opcode) {
        case OPC_MXU_S32MADD:
            /* TODO: Implement emulation of S32MADD instruction. */
            MIPS_INVAL("OPC_MXU_S32MADD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S32MADDU:
            /* TODO: Implement emulation of S32MADDU instruction. */
            MIPS_INVAL("OPC_MXU_S32MADDU");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL00:
            decode_opc_mxu__pool00(env, ctx);
            break;
        case OPC_MXU_S32MSUB:
            /* TODO: Implement emulation of S32MSUB instruction. */
            MIPS_INVAL("OPC_MXU_S32MSUB");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S32MSUBU:
            /* TODO: Implement emulation of S32MSUBU instruction. */
            MIPS_INVAL("OPC_MXU_S32MSUBU");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL01:
            decode_opc_mxu__pool01(env, ctx);
            break;
        case OPC_MXU__POOL02:
            decode_opc_mxu__pool02(env, ctx);
            break;
        case OPC_MXU_D16MUL:
            gen_mxu_d16mul(ctx);
            break;
        case OPC_MXU__POOL03:
            decode_opc_mxu__pool03(env, ctx);
            break;
        case OPC_MXU_D16MAC:
            gen_mxu_d16mac(ctx);
            break;
        case OPC_MXU_D16MACF:
            /* TODO: Implement emulation of D16MACF instruction. */
            MIPS_INVAL("OPC_MXU_D16MACF");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D16MADL:
            /* TODO: Implement emulation of D16MADL instruction. */
            MIPS_INVAL("OPC_MXU_D16MADL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S16MAD:
            /* TODO: Implement emulation of S16MAD instruction. */
            MIPS_INVAL("OPC_MXU_S16MAD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_Q16ADD:
            /* TODO: Implement emulation of Q16ADD instruction. */
            MIPS_INVAL("OPC_MXU_Q16ADD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D16MACE:
            /* TODO: Implement emulation of D16MACE instruction. */
            MIPS_INVAL("OPC_MXU_D16MACE");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL04:
            decode_opc_mxu__pool04(env, ctx);
            break;
        case OPC_MXU__POOL05:
            decode_opc_mxu__pool05(env, ctx);
            break;
        case OPC_MXU__POOL06:
            decode_opc_mxu__pool06(env, ctx);
            break;
        case OPC_MXU__POOL07:
            decode_opc_mxu__pool07(env, ctx);
            break;
        case OPC_MXU__POOL08:
            decode_opc_mxu__pool08(env, ctx);
            break;
        case OPC_MXU__POOL09:
            decode_opc_mxu__pool09(env, ctx);
            break;
        case OPC_MXU__POOL10:
            decode_opc_mxu__pool10(env, ctx);
            break;
        case OPC_MXU__POOL11:
            decode_opc_mxu__pool11(env, ctx);
            break;
        case OPC_MXU_D32ADD:
            /* TODO: Implement emulation of D32ADD instruction. */
            MIPS_INVAL("OPC_MXU_D32ADD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL12:
            decode_opc_mxu__pool12(env, ctx);
            break;
        case OPC_MXU__POOL13:
            decode_opc_mxu__pool13(env, ctx);
            break;
        case OPC_MXU__POOL14:
            decode_opc_mxu__pool14(env, ctx);
            break;
        case OPC_MXU_Q8ACCE:
            /* TODO: Implement emulation of Q8ACCE instruction. */
            MIPS_INVAL("OPC_MXU_Q8ACCE");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S8LDD:
            gen_mxu_s8ldd(ctx);
            break;
        case OPC_MXU_S8STD:
            /* TODO: Implement emulation of S8STD instruction. */
            MIPS_INVAL("OPC_MXU_S8STD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S8LDI:
            /* TODO: Implement emulation of S8LDI instruction. */
            MIPS_INVAL("OPC_MXU_S8LDI");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S8SDI:
            /* TODO: Implement emulation of S8SDI instruction. */
            MIPS_INVAL("OPC_MXU_S8SDI");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL15:
            decode_opc_mxu__pool15(env, ctx);
            break;
        case OPC_MXU__POOL16:
            decode_opc_mxu__pool16(env, ctx);
            break;
        case OPC_MXU__POOL17:
            decode_opc_mxu__pool17(env, ctx);
            break;
        case OPC_MXU_S16LDD:
            /* TODO: Implement emulation of S16LDD instruction. */
            MIPS_INVAL("OPC_MXU_S16LDD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S16STD:
            /* TODO: Implement emulation of S16STD instruction. */
            MIPS_INVAL("OPC_MXU_S16STD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S16LDI:
            /* TODO: Implement emulation of S16LDI instruction. */
            MIPS_INVAL("OPC_MXU_S16LDI");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S16SDI:
            /* TODO: Implement emulation of S16SDI instruction. */
            MIPS_INVAL("OPC_MXU_S16SDI");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D32SLL:
            /* TODO: Implement emulation of D32SLL instruction. */
            MIPS_INVAL("OPC_MXU_D32SLL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D32SLR:
            /* TODO: Implement emulation of D32SLR instruction. */
            MIPS_INVAL("OPC_MXU_D32SLR");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D32SARL:
            /* TODO: Implement emulation of D32SARL instruction. */
            MIPS_INVAL("OPC_MXU_D32SARL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D32SAR:
            /* TODO: Implement emulation of D32SAR instruction. */
            MIPS_INVAL("OPC_MXU_D32SAR");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_Q16SLL:
            /* TODO: Implement emulation of Q16SLL instruction. */
            MIPS_INVAL("OPC_MXU_Q16SLL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_Q16SLR:
            /* TODO: Implement emulation of Q16SLR instruction. */
            MIPS_INVAL("OPC_MXU_Q16SLR");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL18:
            decode_opc_mxu__pool18(env, ctx);
            break;
        case OPC_MXU_Q16SAR:
            /* TODO: Implement emulation of Q16SAR instruction. */
            MIPS_INVAL("OPC_MXU_Q16SAR");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL19:
            decode_opc_mxu__pool19(env, ctx);
            break;
        case OPC_MXU__POOL20:
            decode_opc_mxu__pool20(env, ctx);
            break;
        case OPC_MXU__POOL21:
            decode_opc_mxu__pool21(env, ctx);
            break;
        case OPC_MXU_Q16SCOP:
            /* TODO: Implement emulation of Q16SCOP instruction. */
            MIPS_INVAL("OPC_MXU_Q16SCOP");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_Q8MADL:
            /* TODO: Implement emulation of Q8MADL instruction. */
            MIPS_INVAL("OPC_MXU_Q8MADL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S32SFL:
            /* TODO: Implement emulation of S32SFL instruction. */
            MIPS_INVAL("OPC_MXU_S32SFL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_Q8SAD:
            /* TODO: Implement emulation of Q8SAD instruction. */
            MIPS_INVAL("OPC_MXU_Q8SAD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        default:
            MIPS_INVAL("decode_opc_mxu");
            generate_exception_end(ctx, EXCP_RI);
        }

        gen_set_label(tcg_ctx, l_exit);
        tcg_temp_free(tcg_ctx, t_mxu_cr);
    }
}